

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void compact_array_suite::test_int64(void)

{
  int64_t value [4];
  value_type input [34];
  iarchive in;
  undefined8 local_100;
  long local_f8 [4];
  uchar local_d8 [48];
  iarchive local_a8;
  
  local_d8[0x10] = 'b';
  local_d8[0x11] = 'r';
  local_d8[0x12] = '\x03';
  local_d8[0x13] = '\x13';
  local_d8[0x14] = '#';
  local_d8[0x15] = '3';
  local_d8[0x16] = 'C';
  local_d8[0x17] = 'S';
  local_d8[0x18] = 'c';
  local_d8[0x19] = 's';
  local_d8[0x1a] = '\x04';
  local_d8[0x1b] = '\x14';
  local_d8[0x1c] = '$';
  local_d8[0x1d] = '4';
  local_d8[0x1e] = 'D';
  local_d8[0x1f] = 'T';
  local_d8[0] = 0xae;
  local_d8[1] = ' ';
  local_d8[2] = '\x01';
  local_d8[3] = '\x11';
  local_d8[4] = '!';
  local_d8[5] = '1';
  local_d8[6] = 'A';
  local_d8[7] = 'Q';
  local_d8[8] = 'a';
  local_d8[9] = 'q';
  local_d8[10] = '\x02';
  local_d8[0xb] = '\x12';
  local_d8[0xc] = '\"';
  local_d8[0xd] = '2';
  local_d8[0xe] = 'B';
  local_d8[0xf] = 'R';
  local_d8[0x20] = 'd';
  local_d8[0x21] = 't';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[34]>
            (&local_a8,(uchar (*) [34])local_d8);
  local_f8[2] = 0x7fffffffffffffff;
  local_f8[3] = 0x7fffffffffffffff;
  local_f8[0] = 0x7fffffffffffffff;
  local_f8[1] = 0x7fffffffffffffff;
  trial::protocol::bintoken::iarchive::load_override<long[4]>(&local_a8,&local_f8);
  local_100 = 0x7161514131211101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[0]","INT64_C(0x7161514131211101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1e2,"void compact_array_suite::test_int64()",local_f8,&local_100);
  local_100 = 0x7262524232221202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[1]","INT64_C(0x7262524232221202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1e3,"void compact_array_suite::test_int64()",local_f8 + 1,&local_100);
  local_100 = 0x7363534333231303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[2]","INT64_C(0x7363534333231303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1e4,"void compact_array_suite::test_int64()",local_f8 + 2,&local_100);
  local_100 = 0x7464544434241404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[3]","INT64_C(0x7464544434241404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1e5,"void compact_array_suite::test_int64()",local_f8 + 3,&local_100);
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void test_int64()
{
    const value_type input[] = { token::code::array8_int64, 4 * token::int64::size,
                                 0x01, 0x11, 0x21, 0x31, 0x41, 0x51, 0x61, 0x71,
                                 0x02, 0x12, 0x22, 0x32, 0x42, 0x52, 0x62, 0x72,
                                 0x03, 0x13, 0x23, 0x33, 0x43, 0x53, 0x63, 0x73,
                                 0x04, 0x14, 0x24, 0x34, 0x44, 0x54, 0x64, 0x74 };
    format::iarchive in(input);
    std::int64_t value[4] = { std::numeric_limits<std::int64_t>::max(),
                              std::numeric_limits<std::int64_t>::max(),
                              std::numeric_limits<std::int64_t>::max(),
                              std::numeric_limits<std::int64_t>::max() };
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT64_C(0x7161514131211101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT64_C(0x7262524232221202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT64_C(0x7363534333231303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT64_C(0x7464544434241404));
}